

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O1

void nested_markable::test_opt_opt_bool(void)

{
  return;
}

Assistant:

void test_opt_opt_bool()
  {
    static_assert(sizeof(optopt_bool) == sizeof(char), "excessive size");
    optopt_bool oob {};
    assert(!oob.has_value());
    assert(char(4) == oob.representation_value());

    markable<mark_bool> ob {};
    assert(char(2) == ob.representation_value());
    assert(!ob.has_value());

    oob.assign(ob);
    assert(oob.has_value());
    assert(!oob.value().has_value());
    assert(char(2) == oob.representation_value());

    oob.assign(markable<mark_bool>{true});
    assert(oob.has_value());
    assert(oob.value().has_value());
    assert(oob.value().value() == true);
    assert(char(1) == oob.representation_value());
  }